

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O3

anchor_t __thiscall
YAML::SingleDocParser::LookupAnchor(SingleDocParser *this,Mark *mark,string *name)

{
  const_iterator cVar1;
  Exception *this_00;
  string local_40;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->m_anchors)._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_anchors)._M_t._M_impl.super__Rb_tree_header) {
    return *(anchor_t *)(cVar1._M_node + 2);
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x40);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"the referenced anchor is not defined","");
  Exception::Exception(this_00,mark,&local_40);
  *(undefined ***)this_00 = &PTR__BadFile_008779d0;
  __cxa_throw(this_00,&ParserException::typeinfo,BadFile::~BadFile);
}

Assistant:

anchor_t SingleDocParser::LookupAnchor(const Mark& mark,
                                       const std::string& name) const {
  auto it = m_anchors.find(name);
  if (it == m_anchors.end())
    throw ParserException(mark, ErrorMsg::UNKNOWN_ANCHOR);

  return it->second;
}